

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_mul_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
               _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 local_b0 [8];
  mbedtls_mpi PX;
  mbedtls_ecp_point RP;
  size_t sStack_48;
  uchar b;
  size_t i;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *P_local;
  mbedtls_mpi *m_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&PX.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_b0);
  i._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_b0,&P->X);
  if ((((i._4_4_ == 0) && (i._4_4_ = mbedtls_ecp_copy((mbedtls_ecp_point *)&PX.p,P), i._4_4_ == 0))
      && (i._4_4_ = mbedtls_mpi_lset(&R->X,1), i._4_4_ == 0)) &&
     (i._4_4_ = mbedtls_mpi_lset(&R->Z,0), i._4_4_ == 0)) {
    mbedtls_mpi_free(&R->Y);
    do {
      iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&PX.p,&grp->P);
      if (iVar1 < 0) {
        if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
           (i._4_4_ = ecp_randomize_mxz(grp,(mbedtls_ecp_point *)&PX.p,f_rng,p_rng), i._4_4_ == 0))
        {
          sStack_48 = mbedtls_mpi_bitlen(m);
          goto LAB_001408c6;
        }
        break;
      }
      i._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&PX.p,(mbedtls_mpi *)&PX.p,&grp->P);
    } while (i._4_4_ == 0);
  }
LAB_00140a0c:
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&PX.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_b0);
  return i._4_4_;
LAB_001408c6:
  if (sStack_48 == 0) {
    if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
       (i._4_4_ = ecp_randomize_mxz(grp,R,f_rng,p_rng), i._4_4_ == 0)) {
      i._4_4_ = ecp_normalize_mxz(grp,R);
    }
    goto LAB_00140a0c;
  }
  iVar1 = mbedtls_mpi_get_bit(m,sStack_48 - 1);
  RP.Z.p._7_1_ = (uchar)iVar1;
  i._4_4_ = mbedtls_mpi_safe_cond_swap(&R->X,(mbedtls_mpi *)&PX.p,RP.Z.p._7_1_);
  if (((i._4_4_ != 0) ||
      (i._4_4_ = mbedtls_mpi_safe_cond_swap(&R->Z,(mbedtls_mpi *)&RP.Y.p,RP.Z.p._7_1_), i._4_4_ != 0
      )) || ((i._4_4_ = ecp_double_add_mxz(grp,R,(mbedtls_ecp_point *)&PX.p,R,
                                           (mbedtls_ecp_point *)&PX.p,(mbedtls_mpi *)local_b0),
             i._4_4_ != 0 ||
             ((i._4_4_ = mbedtls_mpi_safe_cond_swap(&R->X,(mbedtls_mpi *)&PX.p,RP.Z.p._7_1_),
              i._4_4_ != 0 ||
              (i._4_4_ = mbedtls_mpi_safe_cond_swap(&R->Z,(mbedtls_mpi *)&RP.Y.p,RP.Z.p._7_1_),
              sStack_48 = sStack_48 - 1, i._4_4_ != 0)))))) goto LAB_00140a0c;
  goto LAB_001408c6;
}

Assistant:

static int ecp_mul_mxz( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                        const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                        int (*f_rng)(void *, unsigned char *, size_t),
                        void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    unsigned char b;
    mbedtls_ecp_point RP;
    mbedtls_mpi PX;

    mbedtls_ecp_point_init( &RP ); mbedtls_mpi_init( &PX );

    /* Save PX and read from P before writing to R, in case P == R */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &PX, &P->X ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_copy( &RP, P ) );

    /* Set R to zero in modified x/z coordinates */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &R->X, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &R->Z, 0 ) );
    mbedtls_mpi_free( &R->Y );

    /* RP.X might be sligtly larger than P, so reduce it */
    MOD_ADD( RP.X );

    /* Randomize coordinates of the starting point */
    if( f_rng != NULL )
        MBEDTLS_MPI_CHK( ecp_randomize_mxz( grp, &RP, f_rng, p_rng ) );

    /* Loop invariant: R = result so far, RP = R + P */
    i = mbedtls_mpi_bitlen( m ); /* one past the (zero-based) most significant bit */
    while( i-- > 0 )
    {
        b = mbedtls_mpi_get_bit( m, i );
        /*
         *  if (b) R = 2R + P else R = 2R,
         * which is:
         *  if (b) double_add( RP, R, RP, R )
         *  else   double_add( R, RP, R, RP )
         * but using safe conditional swaps to avoid leaks
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_swap( &R->X, &RP.X, b ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_swap( &R->Z, &RP.Z, b ) );
        MBEDTLS_MPI_CHK( ecp_double_add_mxz( grp, R, &RP, R, &RP, &PX ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_swap( &R->X, &RP.X, b ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_swap( &R->Z, &RP.Z, b ) );
    }

    /*
     * Knowledge of the projective coordinates may leak the last few bits of the
     * scalar [1], and since our MPI implementation isn't constant-flow,
     * inversion (used for coordinate normalization) may leak the full value
     * of its input via side-channels [2].
     *
     * [1] https://eprint.iacr.org/2003/191
     * [2] https://eprint.iacr.org/2020/055
     *
     * Avoid the leak by randomizing coordinates before we normalize them.
     */
    if( f_rng != NULL )
        MBEDTLS_MPI_CHK( ecp_randomize_mxz( grp, R, f_rng, p_rng ) );

    MBEDTLS_MPI_CHK( ecp_normalize_mxz( grp, R ) );

cleanup:
    mbedtls_ecp_point_free( &RP ); mbedtls_mpi_free( &PX );

    return( ret );
}